

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

void mdef_free(mdef_t *m)

{
  ciphone_t *ptr;
  void *ptr_00;
  long lVar1;
  long lVar2;
  
  if (m != (mdef_t *)0x0) {
    if (m->sen2cimap != (s3cipid_t *)0x0) {
      ckd_free(m->sen2cimap);
    }
    if (m->cd2cisen != (s3senid_t *)0x0) {
      ckd_free(m->cd2cisen);
    }
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      for (lVar2 = 0; lVar2 < m->n_ciphone; lVar2 = lVar2 + 1) {
        if (m->wpos_ci_lclist[lVar1][lVar2] != (ph_lc_t *)0x0) {
          mdef_free_recursive_lc(m->wpos_ci_lclist[lVar1][lVar2]->next);
          mdef_free_recursive_rc(m->wpos_ci_lclist[lVar1][lVar2]->rclist);
        }
      }
    }
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      for (lVar2 = 0; lVar2 < m->n_ciphone; lVar2 = lVar2 + 1) {
        if (m->wpos_ci_lclist[lVar1][lVar2] != (ph_lc_t *)0x0) {
          ckd_free(m->wpos_ci_lclist[lVar1][lVar2]);
        }
      }
    }
    if (m->wpos_ci_lclist != (ph_lc_t ***)0x0) {
      ckd_free_2d(m->wpos_ci_lclist);
    }
    if (m->sseq != (s3senid_t **)0x0) {
      ckd_free_2d(m->sseq);
    }
    if (m->phone != (phone_t *)0x0) {
      ckd_free(m->phone);
    }
    if (m->ciphone_ht != (hash_table_t *)0x0) {
      hash_table_free(m->ciphone_ht);
    }
    lVar1 = 0;
    for (lVar2 = 0; ptr = m->ciphone, lVar2 < m->n_ciphone; lVar2 = lVar2 + 1) {
      ptr_00 = *(void **)((long)&ptr->name + lVar1);
      if (ptr_00 != (void *)0x0) {
        ckd_free(ptr_00);
      }
      lVar1 = lVar1 + 0x10;
    }
    if (ptr != (ciphone_t *)0x0) {
      ckd_free(ptr);
    }
    if (m->st2senmap != (s3senid_t *)0x0) {
      ckd_free(m->st2senmap);
    }
    ckd_free(m);
    return;
  }
  return;
}

Assistant:

void
mdef_free(mdef_t * m)
{
    int i, j;

    if (m) {
        if (m->sen2cimap)
            ckd_free((void *) m->sen2cimap);
        if (m->cd2cisen)
            ckd_free((void *) m->cd2cisen);

        /* RAH, go down the ->next list and delete all the pieces */
        for (i = 0; i < N_WORD_POSN; i++)
            for (j = 0; j < m->n_ciphone; j++)
                if (m->wpos_ci_lclist[i][j]) {
                    mdef_free_recursive_lc(m->wpos_ci_lclist[i][j]->next);
                    mdef_free_recursive_rc(m->wpos_ci_lclist[i][j]->
                                           rclist);
                }

        for (i = 0; i < N_WORD_POSN; i++)
            for (j = 0; j < m->n_ciphone; j++)
                if (m->wpos_ci_lclist[i][j])
                    ckd_free((void *) m->wpos_ci_lclist[i][j]);


        if (m->wpos_ci_lclist)
            ckd_free_2d((void *) m->wpos_ci_lclist);
        if (m->sseq)
            ckd_free_2d((void *) m->sseq);
        /* Free phone context */
        if (m->phone)
            ckd_free((void *) m->phone);
        if (m->ciphone_ht)
            hash_table_free(m->ciphone_ht);

        for (i = 0; i < m->n_ciphone; i++) {
            if (m->ciphone[i].name)
                ckd_free((void *) m->ciphone[i].name);
        }


        if (m->ciphone)
            ckd_free((void *) m->ciphone);

        if (m->st2senmap)
            ckd_free((void *) m->st2senmap);

        ckd_free((void *) m);
    }
}